

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void __thiscall CoreReadTask::execute(CoreReadTask *this)

{
  long lVar1;
  long in_RDI;
  exr_coding_channel_info_t *outc;
  int c_1;
  int c;
  int bytesperpixel;
  uint8_t *curchanptr;
  exr_result_t rv;
  exr_decode_pipeline_t chunk;
  exr_chunk_info_t cinfo;
  int local_25c;
  int local_258;
  int local_254;
  long local_250;
  int local_244;
  undefined1 local_240 [8];
  long local_238;
  short local_230;
  undefined1 local_48 [72];
  
  memset(local_48,0,0x40);
  local_244 = exr_read_scanline_chunk_info
                        (*(undefined8 *)(in_RDI + 0x10),0,*(undefined4 *)(in_RDI + 0x18),local_48);
  if (local_244 == 0) {
    local_244 = exr_decoding_initialize(*(undefined8 *)(in_RDI + 0x10),0,local_48,local_240);
  }
  if (local_244 == 0) {
    local_250 = *(long *)(in_RDI + 0x20);
    local_254 = 0;
    for (local_258 = 0; local_258 < local_230; local_258 = local_258 + 1) {
      local_254 = *(char *)(local_238 + (long)local_258 * 0x30 + 0x19) + local_254;
    }
    for (local_25c = 0; local_25c < local_230; local_25c = local_25c + 1) {
      lVar1 = local_238 + (long)local_25c * 0x30;
      *(long *)(lVar1 + 0x28) = local_250;
      *(int *)(lVar1 + 0x20) = local_254;
      *(int *)(lVar1 + 0x24) = *(int *)(lVar1 + 0xc) * local_254;
      *(short *)(lVar1 + 0x1c) = (short)*(char *)(local_238 + (long)local_25c * 0x30 + 0x19);
      local_250 = local_250 + (int)*(char *)(local_238 + (long)local_25c * 0x30 + 0x19);
    }
    local_244 = exr_decoding_choose_default_routines(*(undefined8 *)(in_RDI + 0x10),0,local_240);
  }
  if (local_244 == 0) {
    exr_decoding_run(*(undefined8 *)(in_RDI + 0x10),0,local_240);
  }
  exr_decoding_destroy(*(undefined8 *)(in_RDI + 0x10),local_240);
  return;
}

Assistant:

void execute () override
    {
        exr_chunk_info_t      cinfo = {0};
        exr_decode_pipeline_t chunk;
        exr_result_t rv = exr_read_scanline_chunk_info (_f, 0, _y, &cinfo);
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_decoding_initialize (_f, 0, &cinfo, &chunk);
        if (rv == EXR_ERR_SUCCESS)
        {
            uint8_t* curchanptr    = _ptr;
            int      bytesperpixel = 0;
            for (int c = 0; c < chunk.channel_count; ++c)
                bytesperpixel += chunk.channels[c].bytes_per_element;
            for (int c = 0; c < chunk.channel_count; ++c)
            {
                exr_coding_channel_info_t& outc = chunk.channels[c];
                outc.decode_to_ptr              = curchanptr;
                outc.user_pixel_stride          = bytesperpixel;
                outc.user_line_stride           = outc.width * bytesperpixel;
                outc.user_bytes_per_element =
                    chunk.channels[c].bytes_per_element;
                curchanptr += chunk.channels[c].bytes_per_element;
            }

            rv = exr_decoding_choose_default_routines (_f, 0, &chunk);
        }
        if (rv == EXR_ERR_SUCCESS) rv = exr_decoding_run (_f, 0, &chunk);
        exr_decoding_destroy (_f, &chunk);
    }